

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redef_base.h
# Opt level: O1

Context __thiscall
mp::
BasicFuncConstrCvt<mp::MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,-1>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
Convert<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>
          (BasicFuncConstrCvt<mp::MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,_1>,mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MinId>
                 *item,int i)

{
  CtxVal CVar1;
  long lVar2;
  
  CVar1 = (item->super_FunctionalConstraint).ctx.value_;
  lVar2 = (long)(item->super_FunctionalConstraint).result_var_;
  if ((CVar1 - CTX_NEG < 2) &&
     (*(double *)(*(long *)(*(long *)this + 0x40) + lVar2 * 8) != INFINITY)) {
    MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,-1>
    ::
    ConvertNonConvexPart<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>
              ((MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,_1>
                *)this,item);
  }
  if (((CVar1 < (CTX_MIX|CTX_ROOT)) && ((0x16U >> (CVar1 & 0x1f) & 1) != 0)) &&
     (*(double *)(*(long *)(*(long *)this + 0x58) + lVar2 * 8) != -INFINITY)) {
    MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,-1>
    ::
    ConvertConvexPart<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MinId>>
              ((MinOrMaxConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,_1>
                *)this,item);
  }
  return (Context)CVar1;
}

Assistant:

Context Convert(const ItemType& item, int i) {
    auto ctx = item.GetContext();
    assert(!ctx.IsNone());
    auto rv = item.GetResultVar();
    auto bnd00 = item.GetAprioriBounds();
    if ( ctx.HasNegative() &&
         GetMC().lb(rv) < bnd00.second ) {  // Need the negative direction
      MPD( ConvertCtxNeg(item, i) );
    }
    if ( ctx.HasPositive() &&
         GetMC().ub(rv) > bnd00.first ) {   // Need the positive direction
      MPD( ConvertCtxPos(item, i) );
    }
    return ctx;        // We assume the implementation just did that
  }